

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap_opkill.h
# Opt level: O2

Analysis __thiscall spvtools::opt::WrapOpKill::GetPreservedAnalyses(WrapOpKill *this)

{
  return kAnalysisTypes|kAnalysisConstants|kAnalysisBuiltinVarId|kAnalysisNameMap|
         kAnalysisCombinators|kAnalysisDecorations|kAnalysisInstrToBlockMapping|kAnalysisBegin;
}

Assistant:

IRContext::Analysis GetPreservedAnalyses() override {
    return IRContext::kAnalysisDefUse |
           IRContext::kAnalysisInstrToBlockMapping |
           IRContext::kAnalysisDecorations | IRContext::kAnalysisCombinators |
           IRContext::kAnalysisNameMap | IRContext::kAnalysisBuiltinVarId |
           IRContext::kAnalysisConstants | IRContext::kAnalysisTypes;
  }